

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void utf::encodeCodePoint(utf8_t *p,utf32_t x)

{
  byte bVar1;
  
  bVar1 = (byte)x;
  if (x < 0x80) {
    *p = bVar1;
    return;
  }
  if (x < 0x10000) {
    if (x < 0x800) {
      *p = (byte)((uint)x >> 6) | 0xc0;
      p[1] = bVar1 & 0x3f | 0x80;
      return;
    }
    *p = (byte)((uint)x >> 0xc) | 0xe0;
    p[1] = (byte)((uint)x >> 6) & 0x3f | 0x80;
    p[2] = bVar1 & 0x3f | 0x80;
    return;
  }
  if (x < 0x200000) {
    *p = (byte)((uint)x >> 0x12) | 0xf0;
    p[1] = (byte)((uint)x >> 0xc) & 0x3f | 0x80;
    p[2] = (byte)((uint)x >> 6) & 0x3f | 0x80;
    p[3] = bVar1 & 0x3f | 0x80;
    return;
  }
  *p = -1;
  return;
}

Assistant:

void
encodeCodePoint(
	utf8_t* p,
	utf32_t x
) {
	if (x < 0x80) {
		p[0] = (uint8_t)x;                             // 0xxxxxxx
	} else if (x < 0x10000) {
		if (x < 0x800) {
			p[0] = (uint8_t)(x >> 6)          | 0xc0;  // 110xxxxx 10xxxxxx
			p[1] = (uint8_t)(x & 0x3f)        | 0x80;
		} else {
			p[0] = (uint8_t)(x >> 12)         | 0xe0;  // 1110xxxx 10xxxxxx 10xxxxxx
			p[1] = (uint8_t)((x >> 6) & 0x3f) | 0x80;
			p[2] = (uint8_t)(x & 0x3f)        | 0x80;
		}
	} else if (x < 0x200000) {
		p[0] = (uint8_t)(x >> 18)             | 0xf0; // 11110xxx 10xxxxxx 10xxxxxx 10xxxxxx
		p[1] = (uint8_t)((x >> 12) & 0x3f)    | 0x80;
		p[2] = (uint8_t)((x >> 6) & 0x3f)     | 0x80;
		p[3] = (uint8_t)(x & 0x3f)            | 0x80;
	} else {
		p[0] = -1;
	}
}